

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

bool Assimp::IFC::GenerateOpenings
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                *openings,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors,
               TempMesh *curmesh,bool check_intersection,bool generate_connection_geometry,
               IfcVector3 *wall_extrusion_axis)

{
  pointer *ppuVar1;
  allocator<Assimp::IFC::TempOpening_*> *this;
  uint uVar2;
  IfcVector3 *pIVar3;
  bool bVar4;
  bool bVar5;
  aiMatrix4x4t<double> *paVar6;
  reference pTVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  aiVector3t<double> *paVar11;
  reference pvVar12;
  double *pdVar13;
  reference pPVar14;
  BoundingBox *ibb_00;
  reference pPVar15;
  reference pvVar16;
  difference_type __n;
  double dVar17;
  double extraout_XMM0_Qa;
  aiVector2t<double> aVar18;
  aiVector2t<double> aVar19;
  aiVector2t<double> aVar20;
  pointer *local_808;
  aiVector3t<double> local_710;
  reference local_6f8;
  IfcVector3 *v3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2_1;
  allocator<Assimp::IFC::TempOpening_*> local_669;
  __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
  local_668;
  __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
  local_660;
  value_type local_658;
  ProjectedWindowContour *local_640;
  ProjectedWindowContour *local_638;
  const_iterator local_630;
  vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_> *local_628;
  ProjectedWindowContour *local_620;
  ProjectedWindowContour *local_618;
  __normal_iterator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_*,_std::vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>_>
  local_610;
  __normal_iterator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_*,_std::vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>_>
  local_608;
  const_iterator local_600;
  TempOpening **local_5f8;
  TempOpening **local_5f0;
  __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
  local_5e8;
  __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
  local_5e0;
  const_iterator local_5d8;
  ProjectedWindowContour *local_5d0;
  ProjectedWindowContour *local_5c8;
  reference local_5c0;
  vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_> *t;
  double local_5b0;
  aiVector2t<double> local_5a8;
  undefined1 local_598 [8];
  BoundingBox newbb;
  ExPolygons poly;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *other;
  BoundingBox *ibb;
  __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
  local_548;
  iterator it;
  bool is_rectangle;
  reference pTStack_538;
  undefined1 local_530 [8];
  vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_> joined_openings;
  BoundingBox bb;
  IfcFloat epsilon;
  IfcVector2 area2;
  IfcVector2 area;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *store;
  aiVector2t<double> local_488;
  aiVector2t<double> local_478;
  aiVector2t<double> local_468;
  aiVector2t<double> local_458;
  undefined1 auStack_448 [8];
  IfcVector2 vv;
  undefined1 local_430 [8];
  IfcVector3 v;
  IfcVector3 *x;
  uint vend;
  uint vi;
  IfcFloat abs_dot_face_nor;
  aiVector3t<double> local_3e8;
  aiVector3t<double> local_3d0;
  undefined1 auStack_3b8 [8];
  IfcVector3 face_nor;
  bool side_flag;
  size_t fend;
  size_t vi_total;
  size_t f;
  undefined1 local_378 [8];
  IfcVector2 vpmax2;
  IfcVector2 vpmin2;
  MinMaxChooser<aiVector2t<double>_> local_349;
  undefined1 local_348 [8];
  IfcVector2 vpmax;
  IfcVector2 vpmin;
  double local_320;
  IfcFloat dmax;
  IfcFloat dmin;
  vector<unsigned_int,_std::allocator<unsigned_int>_> profile_vertcnts;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> profile_verts;
  element_type *peStack_2d8;
  bool is_2d_source;
  TempMesh *profile_data;
  double local_2c8;
  double local_2c0;
  undefined1 auStack_2b8 [8];
  IfcVector3 norm_extrusion_dir;
  TempOpening *opening;
  iterator __end2;
  iterator __begin2;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *__range2;
  IfcVector3 wall_extrusion_axis_norm;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> temp_contour2;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> temp_contour;
  ContourVector contours;
  undefined1 auStack_198 [8];
  IfcMatrix4 minv;
  undefined1 auStack_108 [8];
  IfcMatrix4 m;
  IfcVector3 nor;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour_flat;
  undefined1 local_50 [7];
  bool ok;
  OpeningRefVector contours_to_openings;
  IfcVector3 *wall_extrusion_axis_local;
  bool generate_connection_geometry_local;
  bool check_intersection_local;
  TempMesh *curmesh_local;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors_local;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *openings_local;
  
  contours_to_openings.
  super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)wall_extrusion_axis;
  std::
  vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ::vector((vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
            *)local_50);
  contour_flat.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::vector
            ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&nor.z);
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&m.d4);
  ProjectOntoPlane((IfcMatrix4 *)auStack_108,
                   (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&nor.z,
                   curmesh,(bool *)((long)&contour_flat.
                                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                   (IfcVector3 *)&m.d4);
  if ((contour_flat.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    openings_local._7_1_ = 0;
    minv.d4._0_4_ = 1;
  }
  else {
    contours.
    super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_108;
    paVar6 = aiMatrix4x4t<double>::Inverse
                       ((aiMatrix4x4t<double> *)
                        &contours.
                         super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    minv.d2 = paVar6->d3;
    minv.d3 = paVar6->d4;
    minv.c4 = paVar6->d1;
    minv.d1 = paVar6->d2;
    minv.c2 = paVar6->c3;
    minv.c3 = paVar6->c4;
    minv.b4 = paVar6->c1;
    minv.c1 = paVar6->c2;
    auStack_198 = (undefined1  [8])paVar6->a1;
    minv.a1 = paVar6->a2;
    minv.a2 = paVar6->a3;
    minv.a3 = paVar6->a4;
    minv.a4 = paVar6->b1;
    minv.b1 = paVar6->b2;
    minv.b2 = paVar6->b3;
    minv.b3 = paVar6->b4;
    std::
    vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ::vector((vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
              *)&temp_contour.
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::vector
              ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
               &temp_contour2.
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::vector
              ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
               &wall_extrusion_axis_norm.z);
    wall_extrusion_axis_norm.y =
         (double)((contours_to_openings.
                   super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                 super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage;
    __range2 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
               ((contours_to_openings.
                 super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
               super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    wall_extrusion_axis_norm.x =
         (double)((contours_to_openings.
                   super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                 super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    aiVector3t<double>::Normalize((aiVector3t<double> *)&__range2);
    __end2 = std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::begin
                       (openings);
    opening = (TempOpening *)
              std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::end
                        (openings);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                                  *)&opening);
      if (!bVar4) break;
      pTVar7 = __gnu_cxx::
               __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
               ::operator*(&__end2);
      norm_extrusion_dir.y = (pTVar7->extrusionDir).z;
      auStack_2b8 = (undefined1  [8])(pTVar7->extrusionDir).x;
      norm_extrusion_dir.x = (pTVar7->extrusionDir).y;
      dVar17 = aiVector3t<double>::SquareLength((aiVector3t<double> *)auStack_2b8);
      if (dVar17 <= 1e-10) {
        aiVector3t<double>::aiVector3t((aiVector3t<double> *)&profile_data);
        auStack_2b8 = (undefined1  [8])profile_data;
        norm_extrusion_dir.x = local_2c8;
        norm_extrusion_dir.y = local_2c0;
      }
      else {
        aiVector3t<double>::Normalize((aiVector3t<double> *)auStack_2b8);
      }
      peStack_2d8 = std::__shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>::get
                              (&(pTVar7->profileMesh).
                                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                              );
      bVar4 = false;
      bVar5 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pTVar7->profileMesh2D);
      if (bVar5) {
        dVar17 = aiVector3t<double>::SquareLength((aiVector3t<double> *)auStack_2b8);
        if (0.0 < dVar17) {
          dVar17 = ::operator*((aiVector3t<double> *)auStack_2b8,(aiVector3t<double> *)&__range2);
          if (0.1 <= ABS(dVar17)) {
            dVar17 = ::operator*((aiVector3t<double> *)auStack_2b8,(aiVector3t<double> *)&m.d4);
            bVar4 = 0.9 < ABS(dVar17);
            if (bVar4) {
              peStack_2d8 = std::__shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>::
                            get(&(pTVar7->profileMesh2D).
                                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                               );
            }
          }
          else {
            dVar17 = ::operator*((aiVector3t<double> *)auStack_2b8,(aiVector3t<double> *)&m.d4);
            bVar4 = 0.9 < ABS(dVar17);
            if (bVar4) {
              peStack_2d8 = std::__shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>::
                            get(&(pTVar7->profileMesh2D).
                                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                               );
            }
          }
        }
      }
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                 &profile_vertcnts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&peStack_2d8->mVerts);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dmin,&peStack_2d8->mVertcnt
                );
      sVar8 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                        ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                         &profile_vertcnts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (sVar8 < 3) {
        minv.d4._0_4_ = 3;
      }
      else {
        MinMaxChooser<double>::operator()
                  ((MinMaxChooser<double> *)((long)&vpmin.y + 7),&dmax,&local_320);
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::clear
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                   &temp_contour2.
                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::clear
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                   &wall_extrusion_axis_norm.z);
        aiVector2t<double>::aiVector2t((aiVector2t<double> *)&vpmax.y);
        aiVector2t<double>::aiVector2t((aiVector2t<double> *)local_348);
        MinMaxChooser<aiVector2t<double>_>::operator()
                  (&local_349,(aiVector2t<double> *)&vpmax.y,(aiVector2t<double> *)local_348);
        aiVector2t<double>::aiVector2t((aiVector2t<double> *)&vpmax2.y);
        aiVector2t<double>::aiVector2t((aiVector2t<double> *)local_378);
        MinMaxChooser<aiVector2t<double>_>::operator()
                  ((MinMaxChooser<aiVector2t<double>_> *)((long)&f + 7),
                   (aiVector2t<double> *)&vpmax2.y,(aiVector2t<double> *)local_378);
        vi_total = 0;
        fend = 0;
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dmin);
        for (; vi_total < sVar8; vi_total = vi_total + 1) {
          face_nor.z._7_1_ = true;
          if (bVar4) {
LAB_009a8413:
            x._4_4_ = 0;
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dmin,
                                 vi_total);
            uVar2 = *pvVar12;
            for (; x._4_4_ < uVar2; x._4_4_ = x._4_4_ + 1) {
              v.z = (double)std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                            operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        *)&profile_vertcnts.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,fend);
              ::operator*((aiVector3t<double> *)local_430,(aiMatrix4x4t<double> *)auStack_108,
                          (aiVector3t<double> *)v.z);
              aiVector2t<double>::aiVector2t
                        ((aiVector2t<double> *)auStack_448,(double)local_430,v.x);
              pdVar13 = std::min<double>(&dmax,&v.y);
              dmax = *pdVar13;
              pdVar13 = std::max<double>(&local_320,&v.y);
              local_320 = *pdVar13;
              aiVector2t<double>::aiVector2t(&local_468);
              aVar18 = std::max<double>((aiVector2t<double> *)auStack_448,&local_468);
              vv.x = aVar18.y;
              auStack_448 = (undefined1  [8])aVar18.x;
              local_458 = aVar18;
              aiVector2t<double>::aiVector2t(&local_488,1.0,1.0);
              aVar18 = std::min<double>((aiVector2t<double> *)auStack_448,&local_488);
              vv.x = aVar18.y;
              auStack_448 = (undefined1  [8])aVar18.x;
              local_478 = aVar18;
              if ((face_nor.z._7_1_ & 1) == 0) {
                aVar18 = std::min<double>((aiVector2t<double> *)&vpmax2.y,
                                          (aiVector2t<double> *)auStack_448);
                vpmin2.x = aVar18.y;
                vpmax2.y = aVar18.x;
                aVar19 = std::max<double>((aiVector2t<double> *)local_378,
                                          (aiVector2t<double> *)auStack_448);
                aVar18.y = vpmax.x;
                aVar18.x = (double)local_348;
              }
              else {
                aVar18 = std::min<double>((aiVector2t<double> *)&vpmax.y,
                                          (aiVector2t<double> *)auStack_448);
                vpmin.x = aVar18.y;
                vpmax.y = aVar18.x;
                aVar18 = std::max<double>((aiVector2t<double> *)local_348,
                                          (aiVector2t<double> *)auStack_448);
                aVar19.y = vpmax2.x;
                aVar19.x = (double)local_378;
              }
              vpmax2.x = aVar19.y;
              local_378 = (undefined1  [8])aVar19.x;
              vpmax.x = aVar18.y;
              local_348 = (undefined1  [8])aVar18.x;
              if ((face_nor.z._7_1_ & 1) == 0) {
                pIVar3 = &wall_extrusion_axis_norm;
              }
              else {
                pIVar3 = (IfcVector3 *)&temp_contour2;
              }
              local_808 = (pointer *)&pIVar3->z;
              bVar5 = IsDuplicateVertex((IfcVector2 *)auStack_448,
                                        (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                         *)local_808);
              if (!bVar5) {
                std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                          ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                           local_808,(value_type *)auStack_448);
              }
              fend = fend + 1;
            }
          }
          else {
            ppuVar1 = &profile_vertcnts.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                     operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                                ppuVar1,fend + 2);
            pvVar10 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                      operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *
                                 )ppuVar1,fend);
            ::operator-(&local_3e8,pvVar9,pvVar10);
            ppuVar1 = &profile_vertcnts.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                     operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                                ppuVar1,fend + 1);
            pvVar10 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                      operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *
                                 )ppuVar1,fend);
            ::operator-((aiVector3t<double> *)&abs_dot_face_nor,pvVar9,pvVar10);
            operator^(&local_3d0,&local_3e8,(aiVector3t<double> *)&abs_dot_face_nor);
            paVar11 = aiVector3t<double>::Normalize(&local_3d0);
            face_nor.y = paVar11->z;
            auStack_3b8 = (undefined1  [8])paVar11->x;
            face_nor.x = paVar11->y;
            pdVar13 = &m.d4;
            ::operator*((aiVector3t<double> *)pdVar13,(aiVector3t<double> *)auStack_3b8);
            std::abs((int)pdVar13);
            if (0.9 <= extraout_XMM0_Qa) {
              dVar17 = ::operator*((aiVector3t<double> *)&m.d4,(aiVector3t<double> *)auStack_3b8);
              face_nor.z._7_1_ = 0.0 < dVar17;
              goto LAB_009a8413;
            }
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dmin,
                                 vi_total);
            fend = *pvVar12 + fend;
          }
        }
        sVar8 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                          ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                           &wall_extrusion_axis_norm.z);
        if (2 < sVar8) {
          if (bVar4) {
            __assert_fail("!is_2d_source",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                          ,0x508,
                          "bool Assimp::IFC::GenerateOpenings(std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &, bool, bool, const IfcVector3 &)"
                         );
          }
          aVar18 = ::operator-((aiVector2t<double> *)local_348,(aiVector2t<double> *)&vpmax.y);
          aVar19 = ::operator-((aiVector2t<double> *)local_378,(aiVector2t<double> *)&vpmax2.y);
          sVar8 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                            ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                             &temp_contour2.
                              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((sVar8 < 3) || (ABS(aVar18.x * aVar18.y) < ABS(aVar19.x * aVar19.y))) {
            std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::swap
                      ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                       &temp_contour2.
                        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                       &wall_extrusion_axis_norm.z);
            local_348 = local_378;
            vpmax.x = vpmax2.x;
            vpmax.y = vpmax2.y;
            vpmin.x = vpmin2.x;
          }
        }
        sVar8 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                          ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                           &temp_contour2.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar8 < 3) {
          minv.d4._0_4_ = 3;
        }
        else {
          bb.second.y = ABS(local_320 - dmax) * 0.0001;
          if (((bVar4) || (!check_intersection)) ||
             ((dmax - bb.second.y <= 0.0 && (0.0 <= local_320 + bb.second.y)))) {
            std::pair<aiVector2t<double>,_aiVector2t<double>_>::
            pair<aiVector2t<double>_&,_aiVector2t<double>_&,_true>
                      ((pair<aiVector2t<double>,_aiVector2t<double>_> *)
                       &joined_openings.
                        super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (aiVector2t<double> *)&vpmax.y,(aiVector2t<double> *)local_348);
            if (1e-10 <= ABS((double)local_348 - vpmax.y) * ABS(vpmax.x - vpmin.x)) {
              this = (allocator<Assimp::IFC::TempOpening_*> *)((long)&it._M_current + 7);
              pTStack_538 = pTVar7;
              std::allocator<Assimp::IFC::TempOpening_*>::allocator(this);
              std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>::
              vector((vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                      *)local_530,1,&stack0xfffffffffffffac8,this);
              std::allocator<Assimp::IFC::TempOpening_*>::~allocator
                        ((allocator<Assimp::IFC::TempOpening_*> *)((long)&it._M_current + 7));
              sVar8 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                                ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *
                                 )&temp_contour2.
                                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              it._M_current._6_1_ = sVar8 == 4;
              local_548._M_current =
                   (ProjectedWindowContour *)
                   std::
                   vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                   ::begin((vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                            *)&temp_contour.
                               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_009a8b00:
              do {
                ibb = (BoundingBox *)
                      std::
                      vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                      ::end((vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                             *)&temp_contour.
                                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                bVar4 = __gnu_cxx::operator!=
                                  (&local_548,
                                   (__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                                    *)&ibb);
                if (!bVar4) {
LAB_009a906b:
                  bVar4 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                          empty((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                                &temp_contour2.
                                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (!bVar4) {
                    if (generate_connection_geometry) {
                      local_660._M_current =
                           (TempOpening **)
                           std::
                           vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                           ::begin((vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                    *)local_530);
                      local_668._M_current =
                           (TempOpening **)
                           std::
                           vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                           ::end((vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                  *)local_530);
                      std::allocator<Assimp::IFC::TempOpening_*>::allocator(&local_669);
                      std::
                      vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>::
                      vector<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening**,std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>,void>
                                ((vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>
                                  *)&local_658,local_660,local_668,&local_669);
                      std::
                      vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                      ::push_back((vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                   *)local_50,&local_658);
                      std::
                      vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                      ::~vector(&local_658);
                      std::allocator<Assimp::IFC::TempOpening_*>::~allocator(&local_669);
                    }
                    ProjectedWindowContour::ProjectedWindowContour
                              ((ProjectedWindowContour *)&__range2_1,
                               (Contour *)
                               &temp_contour2.
                                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (BoundingBox *)
                               &joined_openings.
                                super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (bool)(it._M_current._6_1_ & 1));
                    std::
                    vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                    ::push_back((vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                 *)&temp_contour.
                                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (value_type *)&__range2_1);
                    ProjectedWindowContour::~ProjectedWindowContour
                              ((ProjectedWindowContour *)&__range2_1);
                  }
                  minv.d4._0_4_ = 0;
                  break;
                }
                pPVar14 = __gnu_cxx::
                          __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                          ::operator*(&local_548);
                ibb_00 = &pPVar14->bb;
                bVar4 = BoundingBoxesOverlapping
                                  (ibb_00,(BoundingBox *)
                                          &joined_openings.
                                           super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if (!bVar4) {
                  __gnu_cxx::
                  __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                  ::operator++(&local_548);
                  goto LAB_009a8b00;
                }
                pPVar15 = __gnu_cxx::
                          __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                          ::operator*(&local_548);
                if ((pPVar15->is_rectangular & 1U) == 0) {
                  it._M_current._6_1_ = 0;
                }
                pPVar15 = __gnu_cxx::
                          __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                          ::operator*(&local_548);
                pdVar13 = &newbb.second.y;
                std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::vector
                          ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
                           pdVar13);
                MakeDisjunctWindowContours
                          (&pPVar15->contour,
                           (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                           &temp_contour2.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(ExPolygons *)pdVar13
                          );
                sVar8 = std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::
                        size((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                              *)&newbb.second.y);
                if (sVar8 == 1) {
                  pvVar16 = std::
                            vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::
                            operator[]((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                        *)&newbb.second.y,0);
                  GetBoundingBox((BoundingBox *)local_598,&pvVar16->outer);
                  bVar4 = BoundingBoxesOverlapping(ibb_00,(BoundingBox *)local_598);
                  if (bVar4) goto LAB_009a8ca6;
                  std::pair<aiVector2t<double>,_aiVector2t<double>_>::operator=
                            ((pair<aiVector2t<double>,_aiVector2t<double>_> *)
                             &joined_openings.
                              super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(type)local_598);
                  pvVar16 = std::
                            vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::
                            operator[]((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                        *)&newbb.second.y,0);
                  ExtractVerticesFromClipper
                            (&pvVar16->outer,
                             (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                             &temp_contour2.
                              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
                  minv.d4._0_4_ = 0xb;
                }
                else {
LAB_009a8ca6:
                  MergeWindowContours((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                       *)&temp_contour2.
                                          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      &pPVar15->contour,(ExPolygons *)&newbb.second.y);
                  sVar8 = std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                          ::size((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                  *)&newbb.second.y);
                  if (sVar8 < 2) {
                    sVar8 = std::
                            vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::
                            size((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                  *)&newbb.second.y);
                    if (sVar8 == 0) {
                      LogFunctions<Assimp::IFCImporter>::LogWarn("ignoring duplicate opening");
                      std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::clear
                                ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *
                                 )&temp_contour2.
                                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      minv.d4._0_4_ = 10;
                    }
                    else {
                      LogFunctions<Assimp::IFCImporter>::LogDebug("merging overlapping openings");
                      pvVar16 = std::
                                vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                ::operator[]((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                              *)&newbb.second.y,0);
                      ExtractVerticesFromClipper
                                (&pvVar16->outer,
                                 (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *
                                 )&temp_contour2.
                                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
                      aVar18 = std::min<double>((aiVector2t<double> *)
                                                &joined_openings.
                                                 super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                                &ibb_00->first);
                      bb.first.x = aVar18.y;
                      joined_openings.
                      super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aVar18.x;
                      local_5a8 = aVar18;
                      aVar20 = std::max<double>((aiVector2t<double> *)&bb.first.y,
                                                &(pPVar14->bb).second);
                      local_5b0 = aVar20.y;
                      t = (vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                           *)aVar20.x;
                      bb._8_16_ = aVar20;
                      if (generate_connection_geometry) {
                        bb.first.y = (double)t;
                        bb.second.x = local_5b0;
                        local_5c8 = (ProjectedWindowContour *)
                                    std::
                                    vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                    ::begin((vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                             *)&temp_contour.
                                                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        local_5d0 = local_548._M_current;
                        sVar8 = std::
                                distance<__gnu_cxx::__normal_iterator<Assimp::IFC::ProjectedWindowContour*,std::vector<Assimp::IFC::ProjectedWindowContour,std::allocator<Assimp::IFC::ProjectedWindowContour>>>>
                                          ((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                                            )local_5c8,local_548);
                        local_5c0 = std::
                                    vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                    ::operator[]((vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                                  *)local_50,sVar8);
                        local_5e0._M_current =
                             (TempOpening **)
                             std::
                             vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                             ::end((vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                    *)local_530);
                        __gnu_cxx::
                        __normal_iterator<Assimp::IFC::TempOpening*const*,std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>
                        ::__normal_iterator<Assimp::IFC::TempOpening**>
                                  ((__normal_iterator<Assimp::IFC::TempOpening*const*,std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>
                                    *)&local_5d8,&local_5e0);
                        local_5e8._M_current =
                             (TempOpening **)
                             std::
                             vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                             ::begin(local_5c0);
                        local_5f0 = (TempOpening **)
                                    std::
                                    vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                    ::end(local_5c0);
                        local_5f8 = (TempOpening **)
                                    std::
                                    vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>
                                    ::
                                    insert<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening**,std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>,void>
                                              ((vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>
                                                *)local_530,local_5d8,local_5e8,
                                               (__normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
                                                )local_5f0);
                        local_610._M_current =
                             (vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                              *)std::
                                vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                ::begin((vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                         *)local_50);
                        local_618 = (ProjectedWindowContour *)
                                    std::
                                    vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                    ::begin((vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                             *)&temp_contour.
                                                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        local_620 = local_548._M_current;
                        __n = std::
                              distance<__gnu_cxx::__normal_iterator<Assimp::IFC::ProjectedWindowContour*,std::vector<Assimp::IFC::ProjectedWindowContour,std::allocator<Assimp::IFC::ProjectedWindowContour>>>>
                                        ((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                                          )local_618,local_548);
                        local_608 = __gnu_cxx::
                                    __normal_iterator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_*,_std::vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>_>
                                    ::operator+(&local_610,__n);
                        __gnu_cxx::
                        __normal_iterator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>const*,std::vector<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>,std::allocator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>>>
                        ::
                        __normal_iterator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>*>
                                  ((__normal_iterator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>const*,std::vector<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>,std::allocator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>>>
                                    *)&local_600,&local_608);
                        local_628 = (vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                     *)std::
                                       vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                       ::erase((vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                                *)local_50,local_600);
                        aVar20.y = local_5b0;
                        aVar20.x = (double)t;
                      }
                      local_5b0 = aVar20.y;
                      t = (vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                           *)aVar20.x;
                      __gnu_cxx::
                      __normal_iterator<Assimp::IFC::ProjectedWindowContour_const*,std::vector<Assimp::IFC::ProjectedWindowContour,std::allocator<Assimp::IFC::ProjectedWindowContour>>>
                      ::__normal_iterator<Assimp::IFC::ProjectedWindowContour*>
                                ((__normal_iterator<Assimp::IFC::ProjectedWindowContour_const*,std::vector<Assimp::IFC::ProjectedWindowContour,std::allocator<Assimp::IFC::ProjectedWindowContour>>>
                                  *)&local_630,&local_548);
                      local_638 = (ProjectedWindowContour *)
                                  std::
                                  vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                  ::erase((vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                           *)&temp_contour.
                                              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          local_630);
                      local_640 = (ProjectedWindowContour *)
                                  std::
                                  vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                  ::begin((vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                           *)&temp_contour.
                                              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      minv.d4._0_4_ = 0xb;
                      local_548._M_current = local_640;
                    }
                  }
                  else {
                    openings_local._7_1_ = TryAddOpenings_Poly2Tri(openings,nors,curmesh);
                    minv.d4._0_4_ = 1;
                  }
                }
                std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector
                          ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
                           &newbb.second.y);
                if (minv.d4._0_4_ == 10) goto LAB_009a906b;
              } while (minv.d4._0_4_ == 0xb);
              std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>::
              ~vector((vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                       *)local_530);
            }
            else {
              minv.d4._0_4_ = 3;
            }
          }
          else {
            minv.d4._0_4_ = 3;
          }
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dmin);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                 &profile_vertcnts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((minv.d4._0_4_ != 0) && (minv.d4._0_4_ != 3)) goto LAB_009a93bd;
      __gnu_cxx::
      __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
      ::operator++(&__end2);
    }
    bVar4 = std::
            vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
            ::empty((vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                     *)&temp_contour.
                        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar4) {
      openings_local._7_1_ = 0;
      minv.d4._0_4_ = 1;
    }
    else {
      TempMesh::Clear(curmesh);
      Quadrify((ContourVector *)
               &temp_contour.
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,curmesh);
      CleanupWindowContours
                ((ContourVector *)
                 &temp_contour.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      InsertWindowContours
                ((ContourVector *)
                 &temp_contour.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,openings,curmesh);
      CleanupOuterContour((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&nor.z
                          ,curmesh);
      __end2_1 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                           (&curmesh->mVerts);
      v3 = (IfcVector3 *)
           std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                     (&curmesh->mVerts);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                            *)&v3);
        if (!bVar4) break;
        local_6f8 = __gnu_cxx::
                    __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    ::operator*(&__end2_1);
        ::operator*(&local_710,(aiMatrix4x4t<double> *)auStack_198,local_6f8);
        local_6f8->x = local_710.x;
        local_6f8->y = local_710.y;
        local_6f8->z = local_710.z;
        __gnu_cxx::
        __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
        ::operator++(&__end2_1);
      }
      if (generate_connection_geometry) {
        CloseWindows((ContourVector *)
                     &temp_contour.
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(IfcMatrix4 *)auStack_198,
                     (OpeningRefVector *)local_50,curmesh);
      }
      openings_local._7_1_ = 1;
      minv.d4._0_4_ = 1;
    }
LAB_009a93bd:
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~vector
              ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
               &wall_extrusion_axis_norm.z);
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~vector
              ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
               &temp_contour2.
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::
    vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ::~vector((vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
               *)&temp_contour.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~vector
            ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&nor.z);
  std::
  vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ::~vector((vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
             *)local_50);
  return (bool)(openings_local._7_1_ & 1);
}

Assistant:

bool GenerateOpenings(std::vector<TempOpening>& openings,
    const std::vector<IfcVector3>& nors,
    TempMesh& curmesh,
    bool check_intersection,
    bool generate_connection_geometry,
    const IfcVector3& wall_extrusion_axis)
{
    OpeningRefVector contours_to_openings;

    // Try to derive a solid base plane within the current surface for use as
    // working coordinate system. Map all vertices onto this plane and
    // rescale them to [0,1] range. This normalization means all further
    // epsilons need not be scaled.
    bool ok = true;

    std::vector<IfcVector2> contour_flat;

    IfcVector3 nor;
    const IfcMatrix4 m = ProjectOntoPlane(contour_flat, curmesh,  ok, nor);
    if(!ok) {
        return false;
    }

    // Obtain inverse transform for getting back to world space later on
    const IfcMatrix4 minv = IfcMatrix4(m).Inverse();

    // Compute bounding boxes for all 2D openings in projection space
    ContourVector contours;

    std::vector<IfcVector2> temp_contour;
    std::vector<IfcVector2> temp_contour2;

    IfcVector3 wall_extrusion_axis_norm = wall_extrusion_axis;
    wall_extrusion_axis_norm.Normalize();

    for(TempOpening& opening :openings) {

        // extrusionDir may be 0,0,0 on case where the opening mesh is not an
        // IfcExtrudedAreaSolid but something else (i.e. a brep)
        IfcVector3 norm_extrusion_dir = opening.extrusionDir;
        if (norm_extrusion_dir.SquareLength() > 1e-10) {
            norm_extrusion_dir.Normalize();
        }
        else {
            norm_extrusion_dir = IfcVector3();
        }

        TempMesh* profile_data =  opening.profileMesh.get();
        bool is_2d_source = false;
        if (opening.profileMesh2D && norm_extrusion_dir.SquareLength() > 0) {

            if(std::fabs(norm_extrusion_dir * wall_extrusion_axis_norm) < 0.1) {
                // horizontal extrusion
                if (std::fabs(norm_extrusion_dir * nor) > 0.9) {
                    profile_data = opening.profileMesh2D.get();
                    is_2d_source = true;
                }
            }
            else {
                // vertical extrusion
                if (std::fabs(norm_extrusion_dir * nor) > 0.9) {
                    profile_data = opening.profileMesh2D.get();
                    is_2d_source = true;
                }
            }
        }
        std::vector<IfcVector3> profile_verts = profile_data->mVerts;
        std::vector<unsigned int> profile_vertcnts = profile_data->mVertcnt;
        if(profile_verts.size() <= 2) {
            continue;
        }

        // The opening meshes are real 3D meshes so skip over all faces
        // clearly facing into the wrong direction. Also, we need to check
        // whether the meshes do actually intersect the base surface plane.
        // This is done by recording minimum and maximum values for the
        // d component of the plane equation for all polys and checking
        // against surface d.

        // Use the sign of the dot product of the face normal to the plane
        // normal to determine to which side of the difference mesh a
        // triangle belongs. Get independent bounding boxes and vertex
        // sets for both sides and take the better one (we can't just
        // take both - this would likely cause major screwup of vertex
        // winding, producing errors as late as in CloseWindows()).
        IfcFloat dmin, dmax;
        MinMaxChooser<IfcFloat>()(dmin,dmax);

        temp_contour.clear();
        temp_contour2.clear();

        IfcVector2 vpmin,vpmax;
        MinMaxChooser<IfcVector2>()(vpmin,vpmax);

        IfcVector2 vpmin2,vpmax2;
        MinMaxChooser<IfcVector2>()(vpmin2,vpmax2);

        for (size_t f = 0, vi_total = 0, fend = profile_vertcnts.size(); f < fend; ++f) {

            bool side_flag = true;
            if (!is_2d_source) {
                const IfcVector3 face_nor = ((profile_verts[vi_total+2] - profile_verts[vi_total]) ^
                    (profile_verts[vi_total+1] - profile_verts[vi_total])).Normalize();

                const IfcFloat abs_dot_face_nor = std::abs(nor * face_nor);
                if (abs_dot_face_nor < 0.9) {
                    vi_total += profile_vertcnts[f];
                    continue;
                }

                side_flag = nor * face_nor > 0;
            }

            for (unsigned int vi = 0, vend = profile_vertcnts[f]; vi < vend; ++vi, ++vi_total) {
                const IfcVector3& x = profile_verts[vi_total];

                const IfcVector3 v = m * x;
                IfcVector2 vv(v.x, v.y);

                //if(check_intersection) {
                    dmin = std::min(dmin, v.z);
                    dmax = std::max(dmax, v.z);
                //}

                // sanity rounding
                vv = std::max(vv,IfcVector2());
                vv = std::min(vv,one_vec);

                if(side_flag) {
                    vpmin = std::min(vpmin,vv);
                    vpmax = std::max(vpmax,vv);
                }
                else {
                    vpmin2 = std::min(vpmin2,vv);
                    vpmax2 = std::max(vpmax2,vv);
                }

                std::vector<IfcVector2>& store = side_flag ? temp_contour : temp_contour2;

                if (!IsDuplicateVertex(vv, store)) {
                    store.push_back(vv);
                }
            }
        }

        if (temp_contour2.size() > 2) {
            ai_assert(!is_2d_source);
            const IfcVector2 area = vpmax-vpmin;
            const IfcVector2 area2 = vpmax2-vpmin2;
            if (temp_contour.size() <= 2 || std::fabs(area2.x * area2.y) > std::fabs(area.x * area.y)) {
                temp_contour.swap(temp_contour2);

                vpmax = vpmax2;
                vpmin = vpmin2;
            }
        }
        if(temp_contour.size() <= 2) {
            continue;
        }

        // TODO: This epsilon may be too large
        const IfcFloat epsilon = std::fabs(dmax-dmin) * 0.0001;
        if (!is_2d_source && check_intersection && (0 < dmin-epsilon || 0 > dmax+epsilon)) {
            continue;
        }

        BoundingBox bb = BoundingBox(vpmin,vpmax);

        // Skip over very small openings - these are likely projection errors
        // (i.e. they don't belong to this side of the wall)
        if(std::fabs(vpmax.x - vpmin.x) * std::fabs(vpmax.y - vpmin.y) < static_cast<IfcFloat>(1e-10)) {
            continue;
        }
        std::vector<TempOpening*> joined_openings(1, &opening);

        bool is_rectangle = temp_contour.size() == 4;

        // See if this BB intersects or is in close adjacency to any other BB we have so far.
        for (ContourVector::iterator it = contours.begin(); it != contours.end(); ) {
            const BoundingBox& ibb = (*it).bb;

            if (BoundingBoxesOverlapping(ibb, bb)) {

                if (!(*it).is_rectangular) {
                    is_rectangle = false;
                }

                const std::vector<IfcVector2>& other = (*it).contour;
                ClipperLib::ExPolygons poly;

                // First check whether subtracting the old contour (to which ibb belongs)
                // from the new contour (to which bb belongs) yields an updated bb which
                // no longer overlaps ibb
                MakeDisjunctWindowContours(other, temp_contour, poly);
                if(poly.size() == 1) {

                    const BoundingBox newbb = GetBoundingBox(poly[0].outer);
                    if (!BoundingBoxesOverlapping(ibb, newbb )) {
                         // Good guy bounding box
                         bb = newbb ;

                         ExtractVerticesFromClipper(poly[0].outer, temp_contour, false);
                         continue;
                    }
                }

                // Take these two overlapping contours and try to merge them. If they
                // overlap (which should not happen, but in fact happens-in-the-real-
                // world [tm] ), resume using a single contour and a single bounding box.
                MergeWindowContours(temp_contour, other, poly);

                if (poly.size() > 1) {
                    return TryAddOpenings_Poly2Tri(openings, nors, curmesh);
                }
                else if (poly.size() == 0) {
                    IFCImporter::LogWarn("ignoring duplicate opening");
                    temp_contour.clear();
                    break;
                }
                else {
                    IFCImporter::LogDebug("merging overlapping openings");
                    ExtractVerticesFromClipper(poly[0].outer, temp_contour, false);

                    // Generate the union of the bounding boxes
                    bb.first = std::min(bb.first, ibb.first);
                    bb.second = std::max(bb.second, ibb.second);

                    // Update contour-to-opening tables accordingly
                    if (generate_connection_geometry) {
                        std::vector<TempOpening*>& t = contours_to_openings[std::distance(contours.begin(),it)];
                        joined_openings.insert(joined_openings.end(), t.begin(), t.end());

                        contours_to_openings.erase(contours_to_openings.begin() + std::distance(contours.begin(),it));
                    }

                    contours.erase(it);

                    // Restart from scratch because the newly formed BB might now
                    // overlap any other BB which its constituent BBs didn't
                    // previously overlap.
                    it = contours.begin();
                    continue;
                }
            }
            ++it;
        }

        if(!temp_contour.empty()) {
            if (generate_connection_geometry) {
                contours_to_openings.push_back(std::vector<TempOpening*>(
                    joined_openings.begin(),
                    joined_openings.end()));
            }

            contours.push_back(ProjectedWindowContour(temp_contour, bb, is_rectangle));
        }
    }

    // Check if we still have any openings left - it may well be that this is
    // not the cause, for example if all the opening candidates don't intersect
    // this surface or point into a direction perpendicular to it.
    if (contours.empty()) {
        return false;
    }

    curmesh.Clear();

    // Generate a base subdivision into quads to accommodate the given list
    // of window bounding boxes.
    Quadrify(contours,curmesh);

    // Run a sanity cleanup pass on the window contours to avoid generating
    // artifacts during the contour generation phase later on.
    CleanupWindowContours(contours);

    // Previously we reduced all windows to rectangular AABBs in projection
    // space, now it is time to fill the gaps between the BBs and the real
    // window openings.
    InsertWindowContours(contours,openings, curmesh);

    // Clip the entire outer contour of our current result against the real
    // outer contour of the surface. This is necessary because the result
    // of the Quadrify() algorithm is always a square area spanning
    // over [0,1]^2 (i.e. entire projection space).
    CleanupOuterContour(contour_flat, curmesh);

    // Undo the projection and get back to world (or local object) space
    for(IfcVector3& v3 : curmesh.mVerts) {
        v3 = minv * v3;
    }

    // Generate window caps to connect the symmetric openings on both sides
    // of the wall.
    if (generate_connection_geometry) {
        CloseWindows(contours, minv, contours_to_openings, curmesh);
    }
    return true;
}